

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packingvectors.h
# Opt level: O0

uint32_t *
FastPForLib::packingvector<32U>::unpackmetight<unsigned_long>
          (uint32_t *in,unsigned_long *out,size_t outSize,uint32_t bit)

{
  uint uVar1;
  uint32_t bit_00;
  uint in_ECX;
  ulong uVar2;
  ulong in_RDX;
  uint *in_RDI;
  uint32_t *bpointer;
  uint32_t remaining;
  uint32_t buffer [64];
  uint32_t j;
  uint32_t size;
  uint32_t in_stack_fffffffffffffed4;
  uint64_t *in_stack_fffffffffffffed8;
  uint32_t *in_stack_fffffffffffffee0;
  uint local_24;
  uint *local_8;
  
  uVar1 = *in_RDI;
  local_8 = in_RDI + 1;
  for (local_24 = 0; local_24 + 0x1f < uVar1; local_24 = local_24 + 0x20) {
    fastunpack(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed4);
    local_8 = local_8 + in_ECX;
  }
  bit_00 = uVar1 - local_24;
  memcpy(&stack0xfffffffffffffed8,local_8,(ulong)(bit_00 * in_ECX + 0x1f >> 5) << 2);
  uVar2 = (ulong)local_24;
  for (; local_24 != in_RDX; local_24 = local_24 + 0x20) {
    fastunpack(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,bit_00);
  }
  return local_8 + ((in_RDX - uVar2 >> 5) * (ulong)in_ECX -
                   (ulong)((local_24 - uVar1) * in_ECX >> 5));
}

Assistant:

static const uint32_t *unpackmetight(
                                       const uint32_t *in,
                                       IntType * out,
                                       size_t outSize,
                                       const uint32_t bit) {
    const uint32_t size = *in;
    ++in;
    uint32_t j = 0;
    for (; j + PACKSIZE - 1 < size; j += PACKSIZE) {
      fastunpack(in, &out[j], bit);
      in += bit;
    }
    uint32_t buffer[PACKSIZE * 2];
    uint32_t remaining = size - j;
    memcpy(buffer, in, (remaining * bit + 31) / 32 * sizeof(uint32_t));
    uint32_t *bpointer = buffer;
    in += (outSize - j) / PACKSIZE * bit;
    for (; j != outSize; j += PACKSIZE) {
      fastunpack(bpointer, &out[j], bit);
      bpointer += bit;
    }
    in -= (j - size) * bit / 32;
    return in;
  }